

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

bool __thiscall
flatbuffers::Table::VerifyField<unsigned_short>
          (Table *this,Verifier *verifier,voffset_t field,size_t align)

{
  voffset_t elem_off;
  undefined1 local_2b;
  voffset_t field_offset;
  size_t align_local;
  voffset_t field_local;
  Verifier *verifier_local;
  Table *this_local;
  
  elem_off = GetOptionalFieldOffset(this,field);
  local_2b = true;
  if (elem_off != 0) {
    local_2b = VerifierTemplate<false>::VerifyField<unsigned_short>
                         (verifier,(uint8_t *)this,elem_off,align);
  }
  return local_2b;
}

Assistant:

bool VerifyField(const Verifier &verifier, voffset_t field,
                   size_t align) const {
    // Calling GetOptionalFieldOffset should be safe now thanks to
    // VerifyTable().
    auto field_offset = GetOptionalFieldOffset(field);
    // Check the actual field.
    return !field_offset || verifier.VerifyField<T>(data_, field_offset, align);
  }